

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

Var __thiscall
Js::InterpreterStackFrame::ProfiledNewScObject_Helper
          (InterpreterStackFrame *this,Var target,ArgSlot ArgCount,ProfileId profileId,
          InlineCacheIndex inlineCacheIndex,AuxArray<unsigned_int> *spreadIndices)

{
  undefined1 uVar1;
  long lVar2;
  InterpreterStackFrame *pIVar3;
  code *pcVar4;
  bool bVar5;
  RegSlot RVar6;
  RegSlot RVar7;
  Var obj;
  undefined4 *puVar8;
  RecyclableObject *value;
  undefined8 *puVar9;
  undefined6 in_register_00000012;
  Arguments local_40;
  
  local_40.Info = (Type)(CONCAT62(in_register_00000012,ArgCount) & 0xffffffff | 0x1000000);
  local_40.Values = *(Type *)(this + 0x28);
  lVar2 = *(long *)(*(long *)(this + 0x78) + 0x3b8);
  uVar1 = *(undefined1 *)(lVar2 + 0x109);
  *(undefined1 *)(lVar2 + 0x109) = 1;
  obj = ProfilingHelpers::ProfiledNewScObject
                  (target,&local_40,*(FunctionBody **)(this + 0x88),profileId,inlineCacheIndex,
                   spreadIndices);
  *(undefined1 *)(lVar2 + 0x109) = uVar1;
  if ((ArgSlot)(ArgCount + 1) == 0) {
    ::Math::DefaultOverflowPolicy();
  }
  puVar9 = (undefined8 *)(*(long *)(this + 0x30) + (ulong)(ushort)(ArgCount + 1) * -8);
  *(undefined8 **)(this + 0x30) = puVar9;
  *(undefined8 *)(this + 0x28) = *puVar9;
  RVar6 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
  pIVar3 = *(InterpreterStackFrame **)(this + 0x30);
  if (this + (ulong)RVar6 * 8 + 0x160 <= pIVar3) {
    RVar6 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
    RVar7 = FunctionBody::GetOutParamMaxDepth(*(FunctionBody **)(this + 0x88));
    if (pIVar3 < this + (ulong)RVar7 * 8 + (ulong)RVar6 * 8 + 0x160) goto LAB_00a489b3;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar8 = 1;
  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x9ac,
                              "(m_localSlots + this->m_functionBody->GetLocalsCount() <= m_outSp && m_outSp < (m_localSlots + this->m_functionBody->GetLocalsCount() + this->m_functionBody->GetOutParamMaxDepth()))"
                              ,"out args Stack pointer not in range after Pop");
  if (!bVar5) {
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  }
  *puVar8 = 0;
LAB_00a489b3:
  bVar5 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar5) {
    value = JavascriptProxy::AutoProxyWrapper(obj);
    obj = CrossSite::MarshalVar(*(ScriptContext **)(this + 0x78),value,false);
  }
  return obj;
}

Assistant:

Var InterpreterStackFrame::ProfiledNewScObject_Helper(Var target, ArgSlot ArgCount, ProfileId profileId, InlineCacheIndex inlineCacheIndex, const Js::AuxArray<uint32> *spreadIndices)
    {
        Arguments args(CallInfo(CallFlags_New, ArgCount), m_outParams);

        Var newVarInstance = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(this->scriptContext->GetThreadContext())
        {
            newVarInstance = ProfilingHelpers::ProfiledNewScObject(
                target,
                args,
                GetFunctionBody(),
                profileId,
                inlineCacheIndex,
                spreadIndices);
        }
        END_SAFE_REENTRANT_CALL

        PopOut(ArgCount);
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newVarInstance));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            newVarInstance = JavascriptProxy::AutoProxyWrapper(newVarInstance);
            // this might come from a different scriptcontext.
            newVarInstance = CrossSite::MarshalVar(GetScriptContext(), newVarInstance);
        }
#endif
#ifdef TELEMETRY_PROFILED
        {
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().NewScriptObject(target, args, newVarInstance);
        }
#endif
        return newVarInstance;
    }